

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this,cmGeneratorTarget *target)

{
  cmOSXBundleGenerator *this_00;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileUtilityTargetGenerator_0068bd20;
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnUtility;
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  cmOSXBundleGenerator::cmOSXBundleGenerator
            (this_00,target,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  this_00->MacContentFolders = &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnUtility;
  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}